

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.cpp
# Opt level: O1

DEVICE_FEATURE_STATE
Diligent::GetFeatureState
          (DEVICE_FEATURE_STATE RequestedState,DEVICE_FEATURE_STATE SupportedState,char *FeatureName
          )

{
  int iVar1;
  undefined7 in_register_00000039;
  string msg;
  char *local_30;
  string local_28;
  
  iVar1 = (int)CONCAT71(in_register_00000039,RequestedState);
  if (iVar1 != 2) {
    local_30 = FeatureName;
    if (iVar1 != 1) {
      if (iVar1 == 0) {
        return SupportedState == DEVICE_FEATURE_STATE_ENABLED;
      }
      FormatString<char[25]>(&local_28,(char (*) [25])"Unexpected feature state");
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"GetFeatureState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
                 ,0x38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
      return DEVICE_FEATURE_STATE_DISABLED;
    }
    if (SupportedState != DEVICE_FEATURE_STATE_DISABLED) {
      return DEVICE_FEATURE_STATE_ENABLED;
    }
    LogError<true,char_const*,char[30]>
              (false,"GetFeatureState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/RenderDeviceBase.cpp"
               ,0x2f,&local_30,(char (*) [30])0x338705);
  }
  return SupportedState != DEVICE_FEATURE_STATE_DISABLED;
}

Assistant:

static DEVICE_FEATURE_STATE GetFeatureState(DEVICE_FEATURE_STATE RequestedState, DEVICE_FEATURE_STATE SupportedState, const char* FeatureName) noexcept(false)
{
    switch (RequestedState)
    {
        case DEVICE_FEATURE_STATE_DISABLED:
            return SupportedState == DEVICE_FEATURE_STATE_ENABLED ?
                DEVICE_FEATURE_STATE_ENABLED : // the feature is supported by default and can not be disabled
                DEVICE_FEATURE_STATE_DISABLED;

        case DEVICE_FEATURE_STATE_ENABLED:
        {
            if (SupportedState != DEVICE_FEATURE_STATE_DISABLED)
                return DEVICE_FEATURE_STATE_ENABLED;
            else
                LOG_ERROR_AND_THROW(FeatureName, " not supported by this device");
        }

        case DEVICE_FEATURE_STATE_OPTIONAL:
            return SupportedState != DEVICE_FEATURE_STATE_DISABLED ?
                DEVICE_FEATURE_STATE_ENABLED :
                DEVICE_FEATURE_STATE_DISABLED;

        default:
            UNEXPECTED("Unexpected feature state");
            return DEVICE_FEATURE_STATE_DISABLED;
    }
}